

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O0

void __thiscall
HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableTest(HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *this)

{
  allocator_type *in_RDI;
  allocator_type *eql;
  Test *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffd0;
  Hasher local_14;
  
  testing::Test::Test(in_stack_ffffffffffffffc0);
  *(undefined ***)in_RDI = &PTR__HashtableTest_012fd108;
  eql = in_RDI + 1;
  Hasher::Hasher(&local_14,0);
  Hasher::Hasher((Hasher *)&stack0xffffffffffffffd0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffc0,0,
             (int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8,
             (hasher *)in_stack_ffffffffffffffc0,(key_equal *)eql,in_RDI);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

HashtableTest() : ht_() {}